

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O1

bool __thiscall
MultiAgentDecisionProcessDiscrete::SanityCheck(MultiAgentDecisionProcessDiscrete *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  Index IVar7;
  ulong uVar8;
  Index IVar9;
  ulong uVar10;
  Index IVar11;
  double dVar12;
  char float_str [30];
  stringstream ss;
  string local_240;
  string local_220;
  double local_200;
  string local_1f8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar1 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x70))();
  uVar2 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x30))(this);
  uVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xd0))(this);
  local_1d0 = uVar1;
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      IVar9 = (Index)uVar1;
      if (uVar2 != 0) {
        uVar10 = 0;
        do {
          dVar12 = 0.0;
          uVar8 = 0;
          do {
            IVar11 = (Index)uVar10;
            IVar7 = (Index)uVar8;
            local_200 = dVar12;
            dVar12 = (double)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x110))
                                       (this,uVar10,uVar1,uVar8);
            if (dVar12 < 0.0) {
              local_200 = dVar12;
              std::__cxx11::stringstream::stringstream(local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck ",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,"failed: negative probability ",0x1d);
              poVar5 = std::ostream::_M_insert<double>(local_200);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," for p(s\'|s,a)==p(",0x12);
              MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_220,&this->_m_S,IVar7);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,local_220._M_dataplus._M_p,local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
              MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_240,&this->_m_S,IVar11);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                        (&local_1f8,&this->_m_A,IVar9);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                local_240.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
              puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
              *puVar6 = &PTR__E_0059bd80;
              std::__cxx11::stringbuf::str();
              __cxa_throw(puVar6,&E::typeinfo,E::~E);
            }
            if (NAN(dVar12)) {
              std::__cxx11::stringstream::stringstream(local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck ",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"failed: NaN ",0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8," for p(s\'|s,a)==p(",0x12);
              MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_220,&this->_m_S,IVar7);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
              MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_240,&this->_m_S,IVar11);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                        (&local_1f8,&this->_m_A,IVar9);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                local_240.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
              puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
              *puVar6 = &PTR__E_0059bd80;
              std::__cxx11::stringbuf::str();
              __cxa_throw(puVar6,&E::typeinfo,E::~E);
            }
            dVar12 = local_200 + dVar12;
            uVar8 = (ulong)(IVar7 + 1);
          } while (uVar8 < uVar2);
          if (1.0000000000005 < dVar12) {
LAB_004666a7:
            local_200 = dVar12;
            std::__cxx11::stringstream::stringstream(local_1b8);
            sprintf((char *)&local_1f8,"%10.10f",local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck failed:",0x36);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8," transition does not sum to 1 but to:\n",0x26);
            sVar4 = strlen((char *)&local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1f8,sVar4);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n for (s,a)==(",0xe);
            MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_220,&this->_m_S,IVar11);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[",1);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"],",2);
            MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                      (&local_240,&this->_m_A,IVar9);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[",1);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"])",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
            *puVar6 = &PTR__E_0059bd80;
            std::__cxx11::stringbuf::str();
            __cxa_throw(puVar6,&E::typeinfo,E::~E);
          }
          if (dVar12 < 0.9999999999995) goto LAB_004666a7;
          uVar10 = (ulong)(IVar11 + 1);
        } while (uVar10 < uVar2);
      }
      uVar1 = (ulong)(IVar9 + 1);
    } while (uVar1 < local_1d0);
  }
  if (uVar2 != 0) {
    uVar1 = 0;
    local_1c0 = uVar2;
    do {
      if (local_1d0 != 0) {
        uVar10 = 0;
        do {
          uVar2 = 0;
          do {
            dVar12 = 0.0;
            IVar9 = (Index)uVar10;
            IVar7 = (Index)uVar2;
            local_1c8 = uVar2;
            if (uVar3 != 0) {
              uVar8 = 0;
              do {
                IVar11 = (Index)uVar8;
                local_200 = dVar12;
                if (this->_m_eventObservability == true) {
                  dVar12 = (double)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess +
                                               0x130))(this,uVar1,uVar10,uVar2,uVar8);
                }
                else {
                  dVar12 = (double)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess +
                                               0x128))(this,uVar10,uVar2,uVar8);
                }
                if (dVar12 < 0.0) {
                  local_200 = dVar12;
                  std::__cxx11::stringstream::stringstream(local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck ",0x2f);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"failed: negative probability ",0x1d);
                  poVar5 = std::ostream::_M_insert<double>(local_200);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5," for p(o|s\',a)==p(",0x12);
                  MADPComponentDiscreteObservations::GetJointObservationName_abi_cxx11_
                            (&local_220,&this->_m_O,IVar11);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar5,local_220._M_dataplus._M_p,local_220._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
                  MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_240,&this->_m_S,IVar7)
                  ;
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
                  MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                            (&local_1f8,&this->_m_A,IVar9);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_240._M_dataplus._M_p != &local_240.field_2) {
                    operator_delete(local_240._M_dataplus._M_p,
                                    local_240.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != &local_220.field_2) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    local_220.field_2._M_allocated_capacity + 1);
                  }
                  puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
                  *puVar6 = &PTR__E_0059bd80;
                  std::__cxx11::stringbuf::str();
                  __cxa_throw(puVar6,&E::typeinfo,E::~E);
                }
                if (NAN(dVar12)) {
                  std::__cxx11::stringstream::stringstream(local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck ",0x2f);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"failed: NaN for p(o|s\',a)==p(",0x1d);
                  MADPComponentDiscreteObservations::GetJointObservationName_abi_cxx11_
                            (&local_220,&this->_m_O,IVar11);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (local_1a8,local_220._M_dataplus._M_p,
                                      local_220._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
                  MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_240,&this->_m_S,IVar7)
                  ;
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
                  MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                            (&local_1f8,&this->_m_A,IVar9);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_240._M_dataplus._M_p != &local_240.field_2) {
                    operator_delete(local_240._M_dataplus._M_p,
                                    local_240.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != &local_220.field_2) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    local_220.field_2._M_allocated_capacity + 1);
                  }
                  puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
                  *puVar6 = &PTR__E_0059bd80;
                  std::__cxx11::stringbuf::str();
                  __cxa_throw(puVar6,&E::typeinfo,E::~E);
                }
                dVar12 = local_200 + dVar12;
                uVar8 = (ulong)(IVar11 + 1);
              } while (uVar8 < uVar3);
            }
            if (1.0000000000005 < dVar12) {
LAB_004664e4:
              sprintf((char *)&local_1f8,"%10.10f",dVar12);
              std::__cxx11::stringstream::stringstream(local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,"MultiAgentDecisionProcessDiscrete::SanityCheck ",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,"failed: observation does not sum to 1 but to \n",0x2e);
              sVar4 = strlen((char *)&local_1f8);
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1f8,sVar4)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n for (s\',a)==(",0xf);
              MADPComponentDiscreteStates::GetStateName_abi_cxx11_(&local_220,&this->_m_S,IVar7);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[",1);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"],",2);
              MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                        (&local_240,&this->_m_A,IVar9);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[",1);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"])",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                local_240.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
              puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
              *puVar6 = &PTR__E_0059bd80;
              std::__cxx11::stringbuf::str();
              __cxa_throw(puVar6,&E::typeinfo,E::~E);
            }
            if (dVar12 < 0.9999999999995) goto LAB_004664e4;
            uVar2 = (ulong)(IVar7 + 1);
          } while (uVar2 < local_1c0);
          uVar10 = (ulong)(IVar9 + 1);
          uVar2 = local_1c0;
        } while (uVar10 < local_1d0);
      }
    } while ((this->_m_eventObservability == true) &&
            (uVar1 = (ulong)((int)uVar1 + 1), uVar1 < uVar2));
  }
  return true;
}

Assistant:

bool MultiAgentDecisionProcessDiscrete::SanityCheck()
{
    size_t nrJA=GetNrJointActions(),
          nrS=GetNrStates(),
          nrJO=GetNrJointObservations();

    double sum,p;
    bool sane=true;

    // check transition model
    for(Index a=0;a<nrJA;a++)
    {
        for(Index from=0;from<nrS;from++)
        {
            sum=0.0;
            for(Index to=0;to<nrS;to++)
            {
                p=GetTransitionProbability(from,a,to);
                if(p<0)
                {
                    sane=false;
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "<<
                        "failed: negative probability " << p << 
                        " for p(s'|s,a)==p(" << _m_S.GetStateName(to) << "|" << 
                        _m_S.GetStateName(from)<<"," << _m_A.GetJointActionName(a) << ")";
                    throw E(ss);
                }
                if(std::isnan(p))
                {
                    sane=false;
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "<<
                        "failed: NaN " << 
                        " for p(s'|s,a)==p(" << _m_S.GetStateName(to) << "|" << 
                        _m_S.GetStateName(from)<<"," << _m_A.GetJointActionName(a) << ")";
                    throw E(ss);
                }
                sum+=p;
            }
            if((sum>(1.0 + PROB_PRECISION/2)) ||
               (sum < (1.0 - PROB_PRECISION/2)))
            {
                sane=false;
                stringstream ss;
                //string float_str;
                char float_str[30];
                sprintf(float_str, "%10.10f", sum);
                ss << "MultiAgentDecisionProcessDiscrete::SanityCheck failed:"<<
                   " transition does not sum to 1 but to:\n" << float_str << 
                   "\n for (s,a)==(" << _m_S.GetStateName(from) << "[" << from << 
                   "]," << _m_A.GetJointActionName(a) << "[" << a << "])";
                throw E(ss);
            }
        }
    }

    // check observation model

    for(Index from=0;from<nrS;from++)
    {
      for(Index a=0;a<nrJA;a++)
      {
        for(Index to=0;to<nrS;to++)
        {
            sum=0;
            for(Index o=0;o<nrJO;o++)
            {
	        if(_m_eventObservability)
	            p=GetObservationProbability(from,a,to,o);
		else
		    p=GetObservationProbability(a,to,o);
                if(p<0)
                {
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "
                       << "failed: negative probability " << p 
                       << " for p(o|s',a)==p(" 
                       << _m_O.GetJointObservationName(o)
                       << "|" << _m_S.GetStateName(to) 
                       << "," 
                       << _m_A.GetJointActionName(a) 
                       << ")";
                    throw E(ss);
                }
                if(std::isnan(p))
                {
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "
                       << "failed: NaN for p(o|s',a)==p(" 
                       << _m_O.GetJointObservationName(o)
                       << "|" << _m_S.GetStateName(to) 
                       << "," 
                       << _m_A.GetJointActionName(a) 
                       << ")";
                    throw E(ss);
                }
                sum+=p;
            }
            if((sum>(1.0 + PROB_PRECISION/2)) ||
               (sum < (1.0 - PROB_PRECISION/2)))
            {
                char float_str[30];
                sprintf(float_str, "%10.10f", sum);
                sane=false;
                stringstream ss;
                ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "
                   << "failed: observation does not sum to 1 but to \n" 
                   << float_str << "\n for (s',a)==(" << _m_S.GetStateName(to) 
                   << "[" << to << "],"
                   << _m_A.GetJointActionName(a) 
                   << "[" << a << "])";
                throw E(ss);
            }
        }
      }
      if(!_m_eventObservability) break;
    }

    return(sane);
}